

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  U32 UVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  int *piVar14;
  BYTE *pBVar15;
  U32 UVar16;
  int *mEnd;
  BYTE *pBVar17;
  int *piVar18;
  BYTE *pBVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  BYTE *pBVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int *piVar27;
  ulong uVar28;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_c0;
  ulong local_b8;
  int *local_b0;
  int *local_a8;
  uint local_9c;
  int *local_98;
  ZSTD_matchState_t *local_90;
  int local_88;
  uint local_84;
  BYTE *local_80;
  ulong local_78;
  BYTE *local_70;
  BYTE *local_68;
  int *local_60;
  seqStore_t *local_58;
  int *local_50;
  int *local_48;
  uint *local_40;
  BYTE *local_38;
  
  piVar14 = (int *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  local_68 = (ms->window).base;
  pBVar23 = (ms->window).dictBase;
  uVar10 = (ms->window).dictLimit;
  uVar13 = (ulong)uVar10;
  local_70 = local_68 + uVar13;
  uVar11 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).windowLog;
  uVar9 = (ms->cParams).minMatch;
  uVar21 = 6;
  if (uVar9 < 6) {
    uVar21 = uVar9;
  }
  uVar9 = 4;
  if (4 < uVar21) {
    uVar9 = uVar21;
  }
  uVar21 = *rep;
  uVar22 = rep[1];
  ms->lazySkipping = 0;
  piVar27 = (int *)((ulong)(local_70 == (BYTE *)src) + (long)src);
  local_a8 = (int *)src;
  local_40 = rep;
  if (piVar27 < local_60) {
    local_50 = (int *)(pBVar23 + uVar13);
    local_38 = pBVar23 + uVar11;
    local_84 = 1 << ((byte)uVar2 & 0x1f);
    local_88 = uVar10 - 1;
    local_48 = piVar14 + -8;
    local_98 = piVar14;
    local_90 = ms;
    local_80 = pBVar23;
    local_78 = uVar13;
    local_58 = seqStore;
    do {
      iVar24 = (int)piVar27 - (int)local_68;
      iVar25 = iVar24 + 1;
      UVar3 = (ms->window).lowLimit;
      UVar16 = iVar25 - local_84;
      if (iVar25 - UVar3 <= local_84) {
        UVar16 = UVar3;
      }
      if (ms->loadedDictEnd != 0) {
        UVar16 = UVar3;
      }
      uVar10 = iVar25 - uVar21;
      pBVar17 = local_68;
      if (uVar10 < (uint)uVar13) {
        pBVar17 = pBVar23;
      }
      local_b0 = (int *)((long)piVar27 + 1);
      local_9c = uVar22;
      if (local_88 - uVar10 < 3) {
LAB_001e897e:
        uVar26 = 0;
      }
      else {
        uVar26 = 0;
        if (uVar21 <= (iVar24 - UVar16) + 1) {
          if (*local_b0 != *(int *)(pBVar17 + uVar10)) goto LAB_001e897e;
          piVar18 = piVar14;
          if (uVar10 < (uint)uVar13) {
            piVar18 = local_50;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar27 + 5),(BYTE *)((long)(pBVar17 + uVar10) + 4),
                              (BYTE *)piVar14,(BYTE *)piVar18,local_70);
          uVar26 = sVar12 + 4;
          ms = local_90;
        }
      }
      local_c0 = 999999999;
      if (uVar9 == 6) {
        uVar13 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)piVar27,(BYTE *)piVar14,&local_c0);
      }
      else if (uVar9 == 5) {
        uVar13 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)piVar27,(BYTE *)piVar14,&local_c0);
      }
      else {
        uVar13 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)piVar27,(BYTE *)piVar14,&local_c0);
      }
      local_b8 = uVar26;
      if (uVar26 < uVar13) {
        local_b8 = uVar13;
      }
      if (local_b8 < 4) {
        uVar13 = (long)piVar27 - (long)local_a8;
        piVar27 = (int *)((long)piVar27 + (uVar13 >> 8) + 1);
        local_90->lazySkipping = (uint)(0x8ff < uVar13);
        ms = local_90;
        uVar13 = local_78;
        pBVar23 = local_80;
        uVar22 = local_9c;
      }
      else {
        piVar14 = piVar27;
        uVar28 = local_c0;
        if (uVar13 <= uVar26) {
          piVar14 = local_b0;
          uVar28 = 1;
        }
        local_b0 = piVar14;
        if (piVar27 < local_60) {
          do {
            piVar14 = (int *)((long)piVar27 + 1);
            iVar25 = iVar24 + 1;
            uVar10 = (uint)uVar28;
            if (uVar28 == 0) {
              uVar28 = 0;
            }
            else {
              UVar3 = (local_90->window).lowLimit;
              UVar16 = iVar25 - local_84;
              if (iVar25 - UVar3 <= local_84) {
                UVar16 = UVar3;
              }
              if (local_90->loadedDictEnd != 0) {
                UVar16 = UVar3;
              }
              uVar11 = iVar25 - uVar21;
              pBVar23 = local_68;
              if (uVar11 < (uint)local_78) {
                pBVar23 = local_80;
              }
              if (((2 < local_88 - uVar11) && (uVar21 <= iVar25 - UVar16)) &&
                 (*piVar14 == *(int *)(pBVar23 + uVar11))) {
                piVar18 = local_98;
                if (uVar11 < (uint)local_78) {
                  piVar18 = local_50;
                }
                sVar12 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar27 + 5),
                                    (BYTE *)((long)(pBVar23 + uVar11) + 4),(BYTE *)local_98,
                                    (BYTE *)piVar18,local_70);
                if (uVar10 == 0) goto LAB_001e91a0;
                if (sVar12 < 0xfffffffffffffffc) {
                  uVar11 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                    }
                  }
                  if ((int)((uVar11 ^ 0x1f) + (int)local_b8 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
                    uVar28 = 1;
                    local_b8 = sVar12 + 4;
                    local_b0 = piVar14;
                  }
                }
              }
            }
            local_c0 = 999999999;
            if (uVar9 == 6) {
              uVar13 = ZSTD_BtFindBestMatch_extDict_6
                                 (local_90,(BYTE *)piVar14,(BYTE *)local_98,&local_c0);
            }
            else if (uVar9 == 5) {
              uVar13 = ZSTD_BtFindBestMatch_extDict_5
                                 (local_90,(BYTE *)piVar14,(BYTE *)local_98,&local_c0);
            }
            else {
              uVar13 = ZSTD_BtFindBestMatch_extDict_4
                                 (local_90,(BYTE *)piVar14,(BYTE *)local_98,&local_c0);
            }
            piVar18 = local_98;
            uVar10 = (uint)local_c0;
            if ((uVar10 == 0) || (uVar11 = (uint)uVar28, uVar11 == 0)) {
LAB_001e91a0:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            bVar6 = true;
            if (3 < uVar13) {
              iVar5 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              uVar10 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)local_b8 * 4 + -0x1b) < (int)uVar13 * 4 - iVar5) {
                bVar6 = false;
                uVar28 = local_c0;
                local_b8 = uVar13;
                local_b0 = piVar14;
              }
            }
            if (bVar6) {
              if (local_60 <= piVar14) break;
              piVar14 = (int *)((long)piVar27 + 2);
              iVar25 = iVar24 + 2;
              uVar10 = (uint)uVar28;
              if (uVar28 == 0) {
                uVar28 = 0;
              }
              else {
                UVar3 = (local_90->window).lowLimit;
                UVar16 = iVar25 - local_84;
                if (iVar25 - UVar3 <= local_84) {
                  UVar16 = UVar3;
                }
                if (local_90->loadedDictEnd != 0) {
                  UVar16 = UVar3;
                }
                uVar11 = iVar25 - uVar21;
                pBVar23 = local_68;
                if (uVar11 < (uint)local_78) {
                  pBVar23 = local_80;
                }
                if (((2 < local_88 - uVar11) && (uVar21 <= iVar25 - UVar16)) &&
                   (*piVar14 == *(int *)(pBVar23 + uVar11))) {
                  mEnd = local_98;
                  if (uVar11 < (uint)local_78) {
                    mEnd = local_50;
                  }
                  sVar12 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar27 + 6),
                                      (BYTE *)((long)(pBVar23 + uVar11) + 4),(BYTE *)local_98,
                                      (BYTE *)mEnd,local_70);
                  if (uVar10 == 0) goto LAB_001e91a0;
                  if (sVar12 < 0xfffffffffffffffc) {
                    uVar11 = 0x1f;
                    if (uVar10 != 0) {
                      for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                      }
                    }
                    if ((int)((uVar11 ^ 0x1f) + (int)local_b8 * 4 + -0x1e) < (int)(sVar12 + 4) * 4)
                    {
                      uVar28 = 1;
                      local_b8 = sVar12 + 4;
                      local_b0 = piVar14;
                    }
                  }
                }
              }
              local_c0 = 999999999;
              if (uVar9 == 6) {
                uVar13 = ZSTD_BtFindBestMatch_extDict_6
                                   (local_90,(BYTE *)piVar14,(BYTE *)piVar18,&local_c0);
              }
              else if (uVar9 == 5) {
                uVar13 = ZSTD_BtFindBestMatch_extDict_5
                                   (local_90,(BYTE *)piVar14,(BYTE *)piVar18,&local_c0);
              }
              else {
                uVar13 = ZSTD_BtFindBestMatch_extDict_4
                                   (local_90,(BYTE *)piVar14,(BYTE *)piVar18,&local_c0);
              }
              uVar10 = (uint)local_c0;
              if ((uVar10 == 0) || (uVar11 = (uint)uVar28, uVar11 == 0)) goto LAB_001e91a0;
              bVar6 = true;
              if (3 < uVar13) {
                iVar24 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                  }
                }
                uVar10 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)local_b8 * 4 + -0x18) < (int)uVar13 * 4 - iVar24) {
                  bVar6 = false;
                  uVar28 = local_c0;
                  local_b8 = uVar13;
                  local_b0 = piVar14;
                }
              }
              if (bVar6) break;
            }
            iVar24 = iVar25;
            piVar27 = piVar14;
          } while (piVar14 < local_60);
        }
        pBVar23 = local_80;
        piVar14 = local_98;
        uVar10 = uVar21;
        uVar22 = local_9c;
        if (3 < uVar28) {
          pBVar19 = (BYTE *)((long)local_b0 + (3 - (long)(local_68 + uVar28)));
          pBVar15 = local_70;
          pBVar17 = local_68;
          if ((uint)pBVar19 < (uint)local_78) {
            pBVar15 = local_38;
            pBVar17 = local_80;
          }
          if ((local_a8 < local_b0) &&
             (uVar13 = (ulong)pBVar19 & 0xffffffff, pBVar15 < pBVar17 + uVar13)) {
            pBVar17 = pBVar17 + uVar13;
            do {
              piVar27 = (int *)((long)local_b0 + -1);
              pBVar17 = pBVar17 + -1;
              if ((*(BYTE *)piVar27 != *pBVar17) ||
                 (local_b8 = local_b8 + 1, local_b0 = piVar27, piVar27 <= local_a8)) break;
            } while (pBVar15 < pBVar17);
          }
          uVar10 = (U32)uVar28 - 3;
          uVar22 = uVar21;
        }
        if (local_58->maxNbSeq <=
            (ulong)((long)local_58->sequences - (long)local_58->sequencesStart >> 3)) {
LAB_001e91bf:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_58->maxNbLit) {
LAB_001e91de:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar13 = (long)local_b0 - (long)local_a8;
        pBVar17 = local_58->lit;
        if (local_58->litStart + local_58->maxNbLit < pBVar17 + uVar13) {
LAB_001e923b:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_98 < local_b0) {
LAB_001e921c:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < local_b0) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_a8,(BYTE *)local_b0,(BYTE *)local_48);
        }
        else {
          uVar7 = *(undefined8 *)(local_a8 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_a8;
          *(undefined8 *)(pBVar17 + 8) = uVar7;
          if (0x10 < uVar13) {
            pBVar17 = local_58->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - (long)(local_a8 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_a8 + 6);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_a8 + 4);
            *(undefined8 *)(pBVar17 + 0x18) = uVar7;
            if (0x20 < (long)uVar13) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_a8 + lVar20 + 0x20);
                uVar7 = puVar1[1];
                pBVar15 = pBVar17 + lVar20 + 0x20;
                *(undefined8 *)pBVar15 = *puVar1;
                *(undefined8 *)(pBVar15 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_a8 + lVar20 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar15 + 0x18) = uVar7;
                lVar20 = lVar20 + 0x20;
              } while (pBVar15 + 0x20 < pBVar17 + uVar13);
            }
          }
        }
        psVar8 = local_58;
        local_58->lit = local_58->lit + uVar13;
        if (0xffff < uVar13) {
          if (local_58->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_58->longLengthType = ZSTD_llt_literalLength;
          local_58->longLengthPos =
               (U32)((ulong)((long)local_58->sequences - (long)local_58->sequencesStart) >> 3);
        }
        psVar4 = local_58->sequences;
        psVar4->litLength = (U16)uVar13;
        psVar4->offBase = (U32)uVar28;
        if (local_b8 < 3) {
LAB_001e91fd:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_b8 - 3) {
          if (local_58->longLengthType != ZSTD_llt_none) {
LAB_001e925a:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_58->longLengthType = ZSTD_llt_matchLength;
          local_58->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_58->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_b8 - 3);
        local_58->sequences = psVar4 + 1;
        if (local_90->lazySkipping != 0) {
          local_90->lazySkipping = 0;
        }
        piVar27 = (int *)((long)local_b0 + local_b8);
        ms = local_90;
        uVar13 = local_78;
        local_a8 = piVar27;
        do {
          uVar21 = uVar10;
          if (local_60 < piVar27) break;
          iVar25 = (int)piVar27 - (int)local_68;
          UVar3 = (ms->window).lowLimit;
          UVar16 = iVar25 - local_84;
          if (iVar25 - UVar3 <= local_84) {
            UVar16 = UVar3;
          }
          if (ms->loadedDictEnd != 0) {
            UVar16 = UVar3;
          }
          uVar11 = iVar25 - uVar22;
          pBVar17 = local_68;
          if (uVar11 < (uint)uVar13) {
            pBVar17 = pBVar23;
          }
          if (((local_88 - uVar11 < 3) || (iVar25 - UVar16 < uVar22)) ||
             (*piVar27 != *(int *)(pBVar17 + uVar11))) {
            bVar6 = false;
            uVar11 = uVar22;
          }
          else {
            piVar18 = piVar14;
            if (uVar11 < (uint)uVar13) {
              piVar18 = local_50;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(piVar27 + 1),(BYTE *)((long)(pBVar17 + uVar11) + 4),
                                (BYTE *)piVar14,(BYTE *)piVar18,local_70);
            if (psVar8->maxNbSeq <=
                (ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart >> 3))
            goto LAB_001e91bf;
            if (0x20000 < psVar8->maxNbLit) goto LAB_001e91de;
            pBVar23 = psVar8->lit;
            if (psVar8->litStart + psVar8->maxNbLit < pBVar23) goto LAB_001e923b;
            if (piVar14 < local_a8) goto LAB_001e921c;
            if (local_48 < local_a8) {
              ZSTD_safecopyLiterals(pBVar23,(BYTE *)local_a8,(BYTE *)local_a8,(BYTE *)local_48);
            }
            else {
              uVar7 = *(undefined8 *)(local_a8 + 2);
              *(undefined8 *)pBVar23 = *(undefined8 *)local_a8;
              *(undefined8 *)(pBVar23 + 8) = uVar7;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar12 + 4 < 3) goto LAB_001e91fd;
            if (0xffff < sVar12 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_001e925a;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar12 + 1);
            psVar8->sequences = psVar4 + 1;
            piVar27 = (int *)((long)piVar27 + sVar12 + 4);
            bVar6 = true;
            ms = local_90;
            uVar13 = local_78;
            pBVar23 = local_80;
            uVar11 = uVar10;
            uVar10 = uVar22;
            local_a8 = piVar27;
          }
          uVar22 = uVar11;
          uVar21 = uVar10;
        } while (bVar6);
      }
    } while (piVar27 < local_60);
  }
  *local_40 = uVar21;
  local_40[1] = uVar22;
  return (long)piVar14 - (long)local_a8;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}